

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O1

void __thiscall
ConvexDecomposition::Array<ConvexDecomposition::ConvexH::HalfEdge>::allocate
          (Array<ConvexDecomposition::ConvexH::HalfEdge> *this,int s)

{
  HalfEdge *__ptr;
  HalfEdge *pHVar1;
  long lVar2;
  
  if (s < 1) {
    __assert_fail("s>0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                  ,0x5bf,
                  "void ConvexDecomposition::Array<ConvexDecomposition::ConvexH::HalfEdge>::allocate(int) [Type = ConvexDecomposition::ConvexH::HalfEdge]"
                 );
  }
  if (s < this->count) {
    __assert_fail("s>=count",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                  ,0x5c0,
                  "void ConvexDecomposition::Array<ConvexDecomposition::ConvexH::HalfEdge>::allocate(int) [Type = ConvexDecomposition::ConvexH::HalfEdge]"
                 );
  }
  __ptr = this->element;
  this->array_size = s;
  pHVar1 = (HalfEdge *)malloc((ulong)(uint)s << 2);
  this->element = pHVar1;
  if (pHVar1 == (HalfEdge *)0x0) {
    __assert_fail("element",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                  ,0x5c4,
                  "void ConvexDecomposition::Array<ConvexDecomposition::ConvexH::HalfEdge>::allocate(int) [Type = ConvexDecomposition::ConvexH::HalfEdge]"
                 );
  }
  if (0 < this->count) {
    lVar2 = 0;
    do {
      this->element[lVar2] = __ptr[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar2 < this->count);
  }
  if (__ptr != (HalfEdge *)0x0) {
    free(__ptr);
    return;
  }
  return;
}

Assistant:

void Array<Type>::allocate(int s)
{
	assert(s>0);
	assert(s>=count);
	Type *old = element;
	array_size =s;
	element = (Type *) malloc( sizeof(Type)*array_size);
	assert(element);
	for(int i=0;i<count;i++)
	{
		element[i]=old[i];
	}
	if(old)
	{
		free(old);
	}
}